

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O0

void sznet::net::sockets::sz_shutdownwrite(sz_sock sockfd)

{
  int iVar1;
  LogStream *this;
  SourceFile file;
  undefined1 local_ff0 [12];
  Logger local_fe0;
  sz_sock local_c;
  sz_sock sockfd_local;
  
  local_c = sockfd;
  iVar1 = shutdown(sockfd,1);
  if (iVar1 < 0) {
    Logger::SourceFile::SourceFile<101>
              ((SourceFile *)local_ff0,
               (char (*) [101])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SocketsOps.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_ff0._0_8_;
    file.m_size = local_ff0._8_4_;
    Logger::Logger(&local_fe0,file,0x126,false);
    this = Logger::stream(&local_fe0);
    LogStream::operator<<(this,"sockets::sz_shutdownwrite");
    Logger::~Logger(&local_fe0);
  }
  return;
}

Assistant:

void sz_shutdownwrite(sz_sock sockfd)
{
#ifdef SZ_OS_WINDOWS
	if (::shutdown(sockfd, SD_SEND) < 0)
#else
	if (::shutdown(sockfd, SHUT_WR) < 0)
#endif
	{
		LOG_SYSERR << "sockets::sz_shutdownwrite";
	}
}